

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>,_true>
 __thiscall duckdb::EnumColumnWriter::InitializeStatsState(EnumColumnWriter *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x50);
  *puVar1 = &PTR__StringStatisticsState_019e2768;
  *(undefined1 *)(puVar1 + 1) = 0x19;
  *(undefined4 *)((long)puVar1 + 9) = 0;
  puVar1[2] = puVar1 + 4;
  puVar1[3] = 0;
  *(undefined1 *)(puVar1 + 4) = 0;
  puVar1[6] = puVar1 + 8;
  puVar1[7] = 0;
  *(undefined1 *)(puVar1 + 8) = 0;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
          )(unique_ptr<duckdb::ColumnWriterStatistics,_std::default_delete<duckdb::ColumnWriterStatistics>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterStatistics> EnumColumnWriter::InitializeStatsState() {
	return make_uniq<StringStatisticsState>();
}